

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char cVar8;
  long local_50;
  char *local_48;
  char *local_40;
  ulong local_38;
  
  time((time_t *)0x0);
  pcVar3 = getenv("SOURCE_DATE_EPOCH");
  if (pcVar3 != (char *)0x0) {
    strtoul(pcVar3,(char **)0x0,0);
  }
  sym_Init(0x10f8f9);
  opt_B("01");
  opt_G("0123");
  opt_P('\0');
  opt_Q('\x10');
  haltNop = false;
  warnOnHaltNop = true;
  optimizeLoads = false;
  warnOnLdOpt = true;
  verbose = false;
  warnings = true;
  sym_SetExportAll(false);
  local_38 = 0x40;
  local_50 = 0;
  local_40 = (char *)0x0;
LAB_0010f98d:
  iVar1 = musl_getopt_long_only(argc,argv,"b:D:Eg:Hhi:I:LlM:o:P:p:Q:r:VvW:w",longopts,(int *)0x0);
  pcVar3 = musl_optarg;
  if (iVar1 < 0x62) {
    switch(iVar1) {
    case 0x44:
      pcVar6 = strchr(musl_optarg,0x3d);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = "1";
      }
      else {
        *pcVar6 = '\0';
        pcVar6 = pcVar6 + 1;
        pcVar3 = musl_optarg;
      }
      sym_AddString(pcVar3,pcVar6);
      goto LAB_0010f98d;
    case 0x45:
      sym_SetExportAll(true);
      goto LAB_0010f98d;
    case 0x46:
    case 0x47:
    case 0x4a:
    case 0x4b:
    case 0x4e:
    case 0x4f:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x55:
switchD_0010f9b4_caseD_46:
      main_cold_3();
      goto LAB_0010ffee;
    case 0x48:
      if (warnOnHaltNop != true) goto LAB_0010ff6a;
      warning(WARNING_OBSOLETE,"Automatic `nop` after `halt` is deprecated\n");
      haltNop = true;
      warnOnHaltNop = false;
      goto LAB_0010f98d;
    case 0x49:
      goto switchD_0010f9b4_caseD_49;
    case 0x4c:
      if (optimizeLoads == true) goto LAB_0010ff85;
      goto LAB_0010f98d;
    case 0x4d:
      if (dependfile != (FILE *)0x0) {
        warnx("Overriding dependfile %s",local_40);
      }
      uVar2 = (byte)*musl_optarg - 0x2d;
      if (uVar2 == 0) {
        uVar2 = (uint)(byte)musl_optarg[1];
      }
      if (uVar2 == 0) {
        pcVar3 = "<stdout>";
        dependfile = (FILE *)_stdout;
      }
      else {
        dependfile = (FILE *)fopen(musl_optarg,"w");
        pcVar3 = musl_optarg;
      }
      local_40 = pcVar3;
      if ((FILE *)dependfile == (FILE *)0x0) {
        pcVar6 = "Could not open dependfile %s";
LAB_0010ffb5:
        err(pcVar6,pcVar3);
      }
      goto LAB_0010f98d;
    case 0x50:
      fstk_SetPreIncludeFile(musl_optarg);
      goto LAB_0010f98d;
    case 0x51:
      uVar4 = strtoul(musl_optarg + (*musl_optarg == '.'),&local_48,0);
      if ((*musl_optarg != '\0') && (*local_48 == '\0')) {
        if (uVar4 - 0x20 < 0xffffffffffffffe1) {
          pcVar3 = "Argument for option \'Q\' must be between 1 and 31";
          break;
        }
        opt_Q((uint8_t)uVar4);
        goto LAB_0010f98d;
      }
      pcVar3 = "Invalid argument for option \'Q\'";
      break;
    case 0x56:
      pcVar3 = get_package_version_string();
      printf("rgbasm %s\n",pcVar3);
      exit(0);
    case 0x57:
      processWarningFlag(musl_optarg);
      goto LAB_0010f98d;
    default:
      if (iVar1 != 0) {
        if (iVar1 == -1) {
          if (targetFileName == (char *)0x0) {
            targetFileName = objectName;
          }
          else {
            targetFileName[local_50 + -1] = '\0';
          }
          if (musl_optind == argc) {
            main_cold_2();
          }
          else if (musl_optind + 1 == argc) {
            pcVar3 = argv[musl_optind];
            if (verbose == true) {
              printf("Assembling %s\n");
            }
            if (dependfile != (FILE *)0x0) {
              if (targetFileName == (char *)0x0) {
                pcVar3 = 
                "Dependency files can only be created if a target file is specified with either -o, -MQ or -MT"
                ;
                break;
              }
              fprintf((FILE *)dependfile,"%s: %s\n",targetFileName,pcVar3);
            }
            charmap_New("main",(char *)0x0);
            lexer_Init();
            fstk_Init(pcVar3,local_38 & 0xffffffff);
            iVar1 = yyparse();
            if ((iVar1 != 0) && (nbErrors == 0)) {
              nbErrors = 1;
            }
            if (dependfile != (FILE *)0x0) {
              fclose((FILE *)dependfile);
            }
            sect_CheckUnionClosed();
            if (nbErrors == 0) {
              if ((failedOnMissingInclude == false) && (objectName != (char *)0x0)) {
                out_WriteObject();
              }
              return 0;
            }
            goto LAB_00110016;
          }
          main_cold_1();
LAB_00110016:
          errx("Assembly aborted (%u error%s)!");
        }
        goto switchD_0010f9b4_caseD_46;
      }
      if (depType < 0x51) {
        if (depType == 0x47) {
          generatedMissingIncludes = true;
        }
        else if (depType == 0x50) {
          generatePhonyDeps = true;
        }
      }
      else if ((depType == 0x51) || (depType == 0x54)) {
        pcVar6 = musl_optarg;
        if (depType != 0x51) goto LAB_0010fdaf;
        sVar5 = strlen(musl_optarg);
        pcVar6 = (char *)malloc(sVar5 * 2 + 1);
        pcVar7 = pcVar6;
        if (pcVar6 != (char *)0x0) {
          do {
            cVar8 = *pcVar3;
            if (cVar8 == '$') {
              *pcVar7 = '$';
              pcVar7 = pcVar7 + 1;
              cVar8 = *pcVar3;
            }
            else if (cVar8 == '\0') goto LAB_0010fdac;
            pcVar3 = pcVar3 + 1;
            *pcVar7 = cVar8;
            pcVar7 = pcVar7 + 1;
          } while( true );
        }
        pcVar6 = "%s: Failed to allocate memory";
        pcVar3 = "make_escape";
        goto LAB_0010ffb5;
      }
      goto LAB_0010f98d;
    }
  }
  else {
    switch(iVar1) {
    case 0x62:
      sVar5 = strlen(musl_optarg);
      if (sVar5 == 2) {
        opt_B(pcVar3);
        goto LAB_0010f98d;
      }
      pcVar3 = "Must specify exactly 2 characters for option \'b\'";
      break;
    default:
      goto switchD_0010f9b4_caseD_46;
    case 0x67:
      sVar5 = strlen(musl_optarg);
      if (sVar5 == 4) {
        opt_G(pcVar3);
        goto LAB_0010f98d;
      }
      pcVar3 = "Must specify exactly 4 characters for option \'g\'";
      break;
    case 0x68:
      if (haltNop != true) goto LAB_0010f98d;
LAB_0010ff6a:
      pcVar3 = "`-H` and `-h` don\'t make sense together";
      break;
    case 0x69:
      warning(WARNING_OBSOLETE,"`-i` is deprecated; use `-I`\n");
switchD_0010f9b4_caseD_49:
      fstk_AddIncludePath(musl_optarg);
      goto LAB_0010f98d;
    case 0x6c:
      if (warnOnLdOpt == true) {
        warning(WARNING_OBSOLETE,"Automatic `ld` to `ldh` optimization is deprecated\n");
        optimizeLoads = true;
        warnOnLdOpt = false;
        goto LAB_0010f98d;
      }
LAB_0010ff85:
      pcVar3 = "`-L` and `-l` don\'t make sense together";
      break;
    case 0x6f:
      out_SetFileName(musl_optarg);
      goto LAB_0010f98d;
    case 0x70:
      uVar4 = strtoul(musl_optarg,&local_48,0);
      if ((*musl_optarg == '\0') || (*local_48 != '\0')) {
        pcVar3 = "Invalid argument for option \'p\'";
      }
      else {
        if (uVar4 < 0x100) {
          opt_P((uint8_t)uVar4);
          goto LAB_0010f98d;
        }
        pcVar3 = "Argument for option \'p\' must be between 0 and 0xFF";
      }
      break;
    case 0x72:
      local_38 = strtoul(musl_optarg,&local_48,0);
      if ((*musl_optarg != '\0') && (*local_48 == '\0')) goto LAB_0010f98d;
      pcVar3 = "Invalid argument for option \'r\'";
      break;
    case 0x76:
      verbose = true;
      goto LAB_0010f98d;
    case 0x77:
      warnings = false;
      goto LAB_0010f98d;
    }
  }
  errx(pcVar3);
LAB_0010fdac:
  *pcVar7 = '\0';
LAB_0010fdaf:
  sVar5 = strlen(pcVar6);
  pcVar3 = (char *)realloc(targetFileName,sVar5 + local_50 + 2);
  targetFileName = pcVar3;
  if (pcVar3 == (char *)0x0) {
LAB_0010ffee:
    err("Cannot append new file to target file list");
  }
  memcpy(pcVar3 + local_50,pcVar6,sVar5 + 1);
  if (depType == 0x51) {
    free(pcVar6);
    pcVar3 = targetFileName;
  }
  pcVar3[sVar5 + local_50] = ' ';
  local_50 = local_50 + sVar5 + 1;
  goto LAB_0010f98d;
}

Assistant:

int main(int argc, char *argv[])
{
	time_t now = time(NULL);
	char const *sourceDateEpoch = getenv("SOURCE_DATE_EPOCH");

	// Support SOURCE_DATE_EPOCH for reproducible builds
	// https://reproducible-builds.org/docs/source-date-epoch/
	if (sourceDateEpoch)
		now = (time_t)strtoul(sourceDateEpoch, NULL, 0);

	// Perform some init for below
	sym_Init(now);

	// Set defaults

	opt_B("01");
	opt_G("0123");
	opt_P(0);
	opt_Q(16);
	haltNop = false;
	warnOnHaltNop = true;
	optimizeLoads = false;
	warnOnLdOpt = true;
	verbose = false;
	warnings = true;
	sym_SetExportAll(false);
	uint32_t maxDepth = DEFAULT_MAX_DEPTH;
	char const *dependFileName = NULL;
	size_t targetFileNameLen = 0;

	for (int ch; (ch = musl_getopt_long_only(argc, argv, optstring, longopts, NULL)) != -1;) {
		switch (ch) {
			char *endptr;

		case 'b':
			if (strlen(musl_optarg) == 2)
				opt_B(musl_optarg);
			else
				errx("Must specify exactly 2 characters for option 'b'");
			break;

			char *equals;
		case 'D':
			equals = strchr(musl_optarg, '=');
			if (equals) {
				*equals = '\0';
				sym_AddString(musl_optarg, equals + 1);
			} else {
				sym_AddString(musl_optarg, "1");
			}
			break;

		case 'E':
			sym_SetExportAll(true);
			break;

		case 'g':
			if (strlen(musl_optarg) == 4)
				opt_G(musl_optarg);
			else
				errx("Must specify exactly 4 characters for option 'g'");
			break;

		case 'H':
			if (warnOnHaltNop)
				warning(WARNING_OBSOLETE,
					"Automatic `nop` after `halt` is deprecated\n");
			else
				errx("`-H` and `-h` don't make sense together");
			haltNop = true;
			warnOnHaltNop = false;
			break;
		case 'h':
			if (haltNop)
				errx("`-H` and `-h` don't make sense together");
			break;

		// `-i` was the only short option for `--include` until `-I` was
		// introduced to better match the `-I dir` option of gcc and clang.
		case 'i':
			warning(WARNING_OBSOLETE, "`-i` is deprecated; use `-I`\n");
			// fallthrough
		case 'I':
			fstk_AddIncludePath(musl_optarg);
			break;

		case 'L':
			if (optimizeLoads)
				errx("`-L` and `-l` don't make sense together");
			break;
		case 'l':
			if (warnOnLdOpt)
				warning(WARNING_OBSOLETE,
					"Automatic `ld` to `ldh` optimization is deprecated\n");
			else
				errx("`-L` and `-l` don't make sense together");
			optimizeLoads = true;
			warnOnLdOpt = false;
			break;

		case 'M':
			if (dependfile)
				warnx("Overriding dependfile %s", dependFileName);
			if (!strcmp("-", musl_optarg)) {
				dependfile = stdout;
				dependFileName = "<stdout>";
			} else {
				dependfile = fopen(musl_optarg, "w");
				dependFileName = musl_optarg;
			}
			if (dependfile == NULL)
				err("Could not open dependfile %s", dependFileName);
			break;

		case 'o':
			out_SetFileName(musl_optarg);
			break;

		case 'P':
			fstk_SetPreIncludeFile(musl_optarg);
			break;

			unsigned long padByte;
		case 'p':
			padByte = strtoul(musl_optarg, &endptr, 0);

			if (musl_optarg[0] == '\0' || *endptr != '\0')
				errx("Invalid argument for option 'p'");

			if (padByte > 0xFF)
				errx("Argument for option 'p' must be between 0 and 0xFF");

			opt_P(padByte);
			break;

			unsigned long precision;
			const char *precisionArg;
		case 'Q':
			precisionArg = musl_optarg;
			if (precisionArg[0] == '.')
				precisionArg++;
			precision = strtoul(precisionArg, &endptr, 0);

			if (musl_optarg[0] == '\0' || *endptr != '\0')
				errx("Invalid argument for option 'Q'");

			if (precision < 1 || precision > 31)
				errx("Argument for option 'Q' must be between 1 and 31");

			opt_Q(precision);
			break;

		case 'r':
			maxDepth = strtoul(musl_optarg, &endptr, 0);

			if (musl_optarg[0] == '\0' || *endptr != '\0')
				errx("Invalid argument for option 'r'");
			break;

		case 'V':
			printf("rgbasm %s\n", get_package_version_string());
			exit(0);

		case 'v':
			verbose = true;
			break;

		case 'W':
			processWarningFlag(musl_optarg);
			break;

		case 'w':
			warnings = false;
			break;

		// Long-only options
		case 0:
			switch (depType) {
			case 'G':
				generatedMissingIncludes = true;
				break;

			case 'P':
				generatePhonyDeps = true;
				break;

				char *newTarget;
			case 'Q':
			case 'T':
				newTarget = musl_optarg;
				if (depType == 'Q')
					newTarget = make_escape(newTarget);
				size_t newTargetLen = strlen(newTarget) + 1; // Plus the space

				targetFileName = (char *)realloc(targetFileName,
							 targetFileNameLen + newTargetLen + 1);
				if (targetFileName == NULL)
					err("Cannot append new file to target file list");
				memcpy(&targetFileName[targetFileNameLen], newTarget, newTargetLen);
				if (depType == 'Q')
					free(newTarget);
				targetFileNameLen += newTargetLen;
				targetFileName[targetFileNameLen - 1] = ' ';
				break;
			}
			break;

		// Unrecognized options
		default:
			fprintf(stderr, "FATAL: unknown option '%c'\n", ch);
			printUsage();
			exit(1);
		}
	}

	if (targetFileName == NULL)
		targetFileName = objectName;
	else
		targetFileName[targetFileNameLen - 1] = '\0'; // Overwrite the last space

	if (argc == musl_optind) {
		fputs("FATAL: Please specify an input file (pass `-` to read from standard input)\n", stderr);
		printUsage();
		exit(1);
	} else if (argc != musl_optind + 1) {
		fputs("FATAL: More than one input file specified\n", stderr);
		printUsage();
		exit(1);
	}

	char const *mainFileName = argv[musl_optind];

	if (verbose)
		printf("Assembling %s\n", mainFileName);

	if (dependfile) {
		if (!targetFileName)
			errx("Dependency files can only be created if a target file is specified with either -o, -MQ or -MT");

		fprintf(dependfile, "%s: %s\n", targetFileName, mainFileName);
	}

	charmap_New(DEFAULT_CHARMAP_NAME, NULL);

	// Init lexer and file stack, providing file info
	lexer_Init();
	fstk_Init(mainFileName, maxDepth);

	// Perform parse (yyparse is auto-generated from `parser.y`)
	if (yyparse() != 0 && nbErrors == 0)
		nbErrors = 1;

	if (dependfile)
		fclose(dependfile);

	sect_CheckUnionClosed();

	if (nbErrors != 0)
		errx("Assembly aborted (%u error%s)!", nbErrors,
			nbErrors == 1 ? "" : "s");

	// If parse aborted due to missing an include, and `-MG` was given, exit normally
	if (failedOnMissingInclude)
		return 0;

	// If no path specified, don't write file
	if (objectName != NULL)
		out_WriteObject();
	return 0;
}